

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O0

int CfdCreateConfidentialAddress
              (void *handle,char *address,char *confidential_key,char **confidential_address)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  Address *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ElementsConfidentialAddress confidential_addr;
  Pubkey key;
  Address addr;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress *in_stack_fffffffffffff8e0;
  AddressFactory *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  undefined8 in_stack_fffffffffffff8f8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff900;
  allocator *paVar5;
  ElementsAddressFactory *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff940;
  string local_698;
  ElementsConfidentialAddress local_678;
  ElementsConfidentialAddress local_4c0;
  allocator local_301;
  string local_300;
  Pubkey local_2e0;
  allocator local_2c1;
  string local_2c0 [462];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  Address *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x49;
    local_50.funcname = "CfdCreateConfidentialAddress";
    cfd::core::logger::warn<>(&local_50,"confidential address is null.");
    local_72 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"Failed to parameter. confidential address is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff900,error_code,in_stack_fffffffffffff8f0);
    local_72 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar1 = cfd::capi::IsEmptyString(local_18);
  if (!(bool)uVar1) {
    bVar2 = cfd::capi::IsEmptyString((char *)local_20);
    if (!bVar2) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff910);
      paVar5 = &local_2c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,local_18,paVar5);
      cfd::AddressFactory::GetAddress(in_stack_fffffffffffff8e8,(string *)in_stack_fffffffffffff8e0)
      ;
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      paVar5 = &local_301;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_300,(char *)local_20,paVar5);
      cfd::core::Pubkey::Pubkey(&local_2e0,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_4c0);
      cfd::ElementsAddressFactory::GetConfidentialAddress
                (local_20,(ConfidentialKey *)in_stack_fffffffffffff8f0);
      cfd::core::ElementsConfidentialAddress::operator=(&local_4c0,&local_678);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                (in_stack_fffffffffffff8e0);
      cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_698,&local_4c0);
      pcVar4 = cfd::capi::CreateString((string *)CONCAT17(uVar1,in_stack_fffffffffffff940));
      *local_28 = pcVar4;
      std::__cxx11::string::~string((string *)&local_698);
      local_4 = 0;
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                (in_stack_fffffffffffff8e0);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5cf6f5);
      cfd::core::Address::~Address(&in_stack_fffffffffffff8e0->unblinded_address_);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5cf70f);
      return local_4;
    }
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x55;
    local_d0.funcname = "CfdCreateConfidentialAddress";
    cfd::core::logger::warn<>(&local_d0,"confidential key is null or empty.");
    local_f2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,"Failed to parameter. confidential key is null or empty.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff900,error_code,in_stack_fffffffffffff8f0);
    local_f2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_address.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x4f;
  local_90.funcname = "CfdCreateConfidentialAddress";
  cfd::core::logger::warn<>(&local_90,"address is null or empty.");
  local_b2 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. address is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff900,error_code,in_stack_fffffffffffff8f0);
  local_b2 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateConfidentialAddress(
    void* handle, const char* address, const char* confidential_key,
    char** confidential_address) {
  try {
    cfd::Initialize();
    if (confidential_address == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null.");
    }
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null or empty.");
    }
    if (IsEmptyString(confidential_key)) {
      warn(CFD_LOG_SOURCE, "confidential key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null or empty.");
    }

    ElementsAddressFactory factory;
    Address addr = factory.GetAddress(address);
    Pubkey key = Pubkey(confidential_key);

    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(addr, key);
    *confidential_address = CreateString(confidential_addr.GetAddress());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}